

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O1

uint TA_SAREXT_FramePPLB(TA_ParamHolderPriv *params)

{
  TA_ParamHolderOptInput *pTVar1;
  uint uVar2;
  
  pTVar1 = params->optIn;
  uVar2 = TA_SAREXT_Lookback((pTVar1->data).optInReal,pTVar1[1].data.optInReal,
                             pTVar1[2].data.optInReal,pTVar1[3].data.optInReal,
                             pTVar1[4].data.optInReal,pTVar1[5].data.optInReal,
                             pTVar1[6].data.optInReal,pTVar1[7].data.optInReal);
  return uVar2;
}

Assistant:

unsigned int TA_SAREXT_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_SAREXT_Lookback(params->optIn[0].data.optInReal, /* optInStartValue*/
/* Generated */                        params->optIn[1].data.optInReal, /* optInOffsetOnReverse*/
/* Generated */                        params->optIn[2].data.optInReal, /* optInAccelerationInitLong*/
/* Generated */                        params->optIn[3].data.optInReal, /* optInAccelerationLong*/
/* Generated */                        params->optIn[4].data.optInReal, /* optInAccelerationMaxLong*/
/* Generated */                        params->optIn[5].data.optInReal, /* optInAccelerationInitShort*/
/* Generated */                        params->optIn[6].data.optInReal, /* optInAccelerationShort*/
/* Generated */                        params->optIn[7].data.optInReal /* optInAccelerationMaxShort*/ );
/* Generated */ }